

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O2

void Kf_SetMergePairs(Kf_Set_t *p,Kf_Cut_t *pCut0,Kf_Cut_t *pCuts,int nCuts,int fArea)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  Kf_Cut_t *pKVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  Kf_Cut_t *pKVar9;
  
  Kf_HashPopulate(p,pCut0);
  pKVar4 = pCuts + nCuts;
  do {
    if (pKVar4 <= pCuts) {
      Kf_HashCleanup(p,0);
      return;
    }
    if ((pCuts->nLeaves + pCut0->nLeaves <= (int)(uint)p->nLutSize) ||
       (uVar5 = pCuts->Sign | pCut0->Sign, uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555),
       uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333),
       (ushort)(byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) <=
       p->nLutSize)) {
      Kf_HashCleanup(p,pCut0->nLeaves);
      for (lVar7 = 0; iVar3 = pCuts->nLeaves, lVar7 < iVar3; lVar7 = lVar7 + 1) {
        iVar3 = Kf_HashFindOrAdd(p,pCuts->pLeaves[lVar7]);
        if (iVar3 != 0) {
          iVar3 = pCuts->nLeaves;
          break;
        }
      }
      if (iVar3 <= (int)lVar7) {
        p->CutCount[1] = p->CutCount[1] + 1;
        uVar5 = pCuts->Sign;
        uVar2 = pCut0->Sign;
        piVar8 = p->pList + p->nTEntries;
        while (-1 < (long)*piVar8) {
          pKVar9 = p->pCutsR + *piVar8;
          if (pKVar9->Sign == (uVar5 | uVar2)) {
            iVar3 = Kf_SetCutDominatedByThis(p,pKVar9);
            if (iVar3 != 0) goto LAB_005f1978;
          }
          piVar8 = &pKVar9->iNext;
        }
        iVar3 = p->nCuts;
        p->nCuts = iVar3 + 1;
        pKVar9 = p->pCutsR + iVar3;
        iVar1 = p->nTEntries;
        p->pCutsR[iVar3].nLeaves = iVar1;
        iVar6 = iVar1;
        for (lVar7 = 0; lVar7 < iVar6; lVar7 = lVar7 + 1) {
          pKVar9->pLeaves[lVar7] = p->pTable[p->pPlace[lVar7]];
          iVar6 = p->nTEntries;
        }
        pKVar9->Sign = pCuts->Sign | pCut0->Sign;
        iVar6 = pCuts->Delay;
        if (pCuts->Delay < pCut0->Delay) {
          iVar6 = pCut0->Delay;
        }
        pKVar9->Delay = iVar6;
        pKVar9->Area = pCut0->Area + pCuts->Area;
        pKVar9->iNext = p->pList[iVar1];
        p->pList[iVar1] = iVar3;
      }
    }
LAB_005f1978:
    pCuts = pCuts + 1;
  } while( true );
}

Assistant:

static inline void Kf_SetMergePairs( Kf_Set_t * p, Kf_Cut_t * pCut0, Kf_Cut_t * pCuts, int nCuts, int fArea )
{
    Kf_Cut_t * pCut1, * pCutR;  int i;
    Kf_HashPopulate( p, pCut0 );
    for ( pCut1 = pCuts; pCut1 < pCuts + nCuts; pCut1++ )
    {
        if ( pCut0->nLeaves + pCut1->nLeaves > p->nLutSize && Kf_SetCountBits(pCut0->Sign | pCut1->Sign) > p->nLutSize )
            continue;
        Kf_HashCleanup( p, pCut0->nLeaves );
        for ( i = 0; i < pCut1->nLeaves; i++ )
            if ( Kf_HashFindOrAdd(p, pCut1->pLeaves[i]) )
                break;
        if ( i < pCut1->nLeaves )
            continue;
        p->CutCount[1]++;        
        if ( Kf_SetRemoveDuplicates(p, p->nTEntries, pCut0->Sign | pCut1->Sign) )
            continue;
        // create new cut
        pCutR = p->pCutsR + p->nCuts++;
        pCutR->nLeaves = p->nTEntries;
        for ( i = 0; i < p->nTEntries; i++ )
            pCutR->pLeaves[i] = p->pTable[p->pPlace[i]];
        pCutR->Sign  = pCut0->Sign | pCut1->Sign;
        pCutR->Delay = Abc_MaxInt(pCut0->Delay, pCut1->Delay);
        pCutR->Area  = pCut0->Area + pCut1->Area;
        // add new cut
        Kf_SetAddToList( p, pCutR, 0 );
    }
    Kf_HashCleanup( p, 0 );
}